

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckSignature(TypeChecker *this,TypeVector *sig,char *desc)

{
  Enum EVar1;
  Result RVar2;
  pointer pTVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  Type local_3c;
  char *local_38;
  
  pTVar3 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar3;
  if (lVar5 == 0) {
    RVar2.enum_ = Ok;
  }
  else {
    uVar6 = lVar5 >> 2;
    iVar4 = -1;
    uVar7 = 0;
    bVar8 = 0;
    local_38 = desc;
    do {
      EVar1 = pTVar3[uVar7].enum_;
      local_3c.enum_ = Any;
      RVar2 = PeekType(this,(int)uVar6 + iVar4,&local_3c);
      bVar8 = bVar8 | RVar2.enum_ == Error |
              (local_3c.enum_ != EVar1 && (local_3c.enum_ != Any && EVar1 != Any));
      uVar7 = uVar7 + 1;
      pTVar3 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pTVar3 >> 2;
      iVar4 = iVar4 + -1;
    } while (uVar7 < uVar6);
    RVar2.enum_ = (Enum)bVar8;
    desc = local_38;
  }
  PrintStackIfFailed(this,RVar2,desc,sig);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckSignature(const TypeVector& sig, const char* desc) {
  Result result = Result::Ok;
  for (size_t i = 0; i < sig.size(); ++i) {
    result |= PeekAndCheckType(sig.size() - i - 1, sig[i]);
  }
  PrintStackIfFailed(result, desc, sig);
  return result;
}